

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

int yy_list_prefix_expr(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int extraout_EAX;
  int iVar7;
  int iVar8;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar9;
  char *cclass;
  int yypos758;
  int iVar10;
  code *pcVar11;
  char *pcVar12;
  char cVar13;
  int yythunkpos758;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar10 = 4;
  yyDo(G,yyPush,4,0,"yyPush");
  iVar7 = G->pos;
  iVar3 = G->thunkpos;
  iVar4 = yymatchChar(G,0x5b);
  if (iVar4 != 0) {
    iVar4 = G->pos;
    iVar8 = G->thunkpos;
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar5 = yymatchChar(G,0x2a);
    if (iVar5 != 0) {
      yyText(G,G->begin,G->end);
      iVar5 = G->pos;
      iVar9 = G->begin;
      G->end = iVar5;
      pcVar11 = yy_1_reduce_operator;
      pcVar12 = "yy_1_reduce_operator";
      goto LAB_00118511;
    }
    G->pos = iVar4;
    G->thunkpos = iVar8;
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar5 = yymatchChar(G,0x2b);
    if (iVar5 == 0) {
LAB_00118577:
      G->pos = iVar4;
      G->thunkpos = iVar8;
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar5 = yymatchChar(G,0x2d);
      if (iVar5 != 0) {
        yyText(G,G->begin,G->end);
        G->end = G->pos;
        yyDo(G,yy_3_reduce_operator,G->begin,G->pos,"yy_3_reduce_operator");
        goto LAB_00118683;
      }
      G->pos = iVar4;
      G->thunkpos = iVar8;
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar5 = yymatchString(G,"<=");
      if (iVar5 == 0) {
        G->pos = iVar4;
        G->thunkpos = iVar8;
        yyText(G,G->begin,G->end);
        G->begin = G->pos;
        iVar5 = yymatchString(G,">=");
        if (iVar5 != 0) {
          yyText(G,G->begin,G->end);
          iVar5 = G->pos;
          iVar9 = G->begin;
          G->end = iVar5;
          pcVar11 = yy_5_reduce_operator;
          pcVar12 = "yy_5_reduce_operator";
          goto LAB_00118511;
        }
        G->pos = iVar4;
        G->thunkpos = iVar8;
        yyText(G,G->begin,G->end);
        iVar5 = G->pos;
        iVar9 = G->thunkpos;
        G->begin = iVar5;
        iVar6 = yymatchString(G,"min");
        cVar13 = '\v';
        if (iVar6 == 0) {
          G->pos = iVar5;
          G->thunkpos = iVar9;
          iVar6 = yymatchString(G,"max");
          if (iVar6 == 0) {
            G->pos = iVar5;
            G->thunkpos = iVar9;
            iVar5 = yymatchString(G,"gcd");
            cVar13 = (iVar5 == 0) * '\t';
          }
        }
        if ((cVar13 == '\v') || (cVar13 == '\0')) {
          yyText(G,G->begin,G->end);
          G->end = G->pos;
          yyDo(G,yy_6_reduce_operator,G->begin,G->pos,"yy_6_reduce_operator");
          cVar13 = '\0';
        }
      }
      else {
        yyText(G,G->begin,G->end);
        iVar5 = G->pos;
        iVar9 = G->begin;
        G->end = iVar5;
        pcVar11 = yy_4_reduce_operator;
        pcVar12 = "yy_4_reduce_operator";
LAB_00118511:
        yyDo(G,pcVar11,iVar9,iVar5,pcVar12);
        cVar13 = '\x03';
      }
    }
    else {
      iVar5 = G->pos;
      iVar9 = G->thunkpos;
      iVar6 = yymatchClass(G,(uchar *)"",cclass);
      if (iVar6 != 0) goto LAB_00118577;
      G->pos = iVar5;
      G->thunkpos = iVar9;
      yyText(G,G->begin,G->end);
      G->end = G->pos;
      yyDo(G,yy_2_reduce_operator,G->begin,G->pos,"yy_2_reduce_operator");
LAB_00118683:
      cVar13 = '\x03';
    }
    if (cVar13 == '\t') {
      G->pos = iVar4;
      G->thunkpos = iVar8;
    }
    else {
      yyDo(G,yySet,-4,0,"yySet");
      iVar4 = yymatchChar(G,0x5d);
      if (iVar4 != 0) {
        do {
          iVar4 = G->pos;
          iVar8 = G->thunkpos;
          iVar5 = yy_ws(G);
        } while (iVar5 != 0);
        G->pos = iVar4;
        G->thunkpos = iVar8;
        iVar4 = yy_list_infix_expr(G);
        if (iVar4 != 0) {
          yyDo(G,yySet,-3,0,"yySet");
          yyDo(G,yy_1_list_prefix_expr,G->begin,G->end,"yy_1_list_prefix_expr");
          iVar10 = 3;
          iVar7 = extraout_EAX;
          goto LAB_00118a3a;
        }
      }
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar7 = yy_list_infix_expr(G);
  if (iVar7 != 0) {
    yyDo(G,yySet,-2,0,"yySet");
    yyDo(G,yy_2_list_prefix_expr,G->begin,G->end,"yy_2_list_prefix_expr");
    do {
      iVar3 = G->pos;
      iVar4 = G->thunkpos;
      do {
        iVar7 = G->pos;
        iVar10 = G->thunkpos;
        iVar8 = yy_ws(G);
      } while (iVar8 != 0);
      G->pos = iVar7;
      G->thunkpos = iVar10;
      iVar7 = yymatchChar(G,0x3d);
      if (iVar7 == 0) {
LAB_00118859:
        G->pos = iVar3;
        G->thunkpos = iVar4;
        do {
          iVar7 = G->pos;
          iVar10 = G->thunkpos;
          iVar8 = yy_ws(G);
        } while (iVar8 != 0);
        G->pos = iVar7;
        G->thunkpos = iVar10;
        iVar7 = yymatchString(G,":=");
        if (iVar7 != 0) {
          iVar10 = G->pos;
          iVar8 = G->thunkpos;
          iVar7 = yymatchChar(G,0x3d);
          iVar5 = 9;
          if (iVar7 == 0) {
            G->pos = iVar10;
            G->thunkpos = iVar8;
            iVar5 = 0;
          }
          if (iVar5 != 9) {
            if (iVar5 != 0) goto LAB_00118a0c;
            do {
              iVar7 = G->pos;
              iVar10 = G->thunkpos;
              iVar8 = yy_ws(G);
            } while (iVar8 != 0);
            G->pos = iVar7;
            G->thunkpos = iVar10;
            iVar7 = yy_list_prefix_expr(G);
            if (iVar7 != 0) {
              yyDo(G,yySet,-1,0,"yySet");
              iVar7 = G->begin;
              iVar10 = G->end;
              pcVar11 = yy_4_list_prefix_expr;
              pcVar12 = "yy_4_list_prefix_expr";
              goto LAB_00118928;
            }
          }
        }
        G->pos = iVar3;
        G->thunkpos = iVar4;
        do {
          iVar7 = G->pos;
          iVar10 = G->thunkpos;
          iVar8 = yy_ws(G);
        } while (iVar8 != 0);
        G->pos = iVar7;
        G->thunkpos = iVar10;
        iVar7 = yymatchString(G,"::=");
        if (iVar7 == 0) {
LAB_00118a06:
          iVar5 = 0xb;
        }
        else {
          iVar10 = G->pos;
          iVar8 = G->thunkpos;
          iVar7 = yymatchChar(G,0x3d);
          iVar5 = 0xb;
          if (iVar7 == 0) {
            G->pos = iVar10;
            G->thunkpos = iVar8;
            do {
              iVar7 = G->pos;
              iVar10 = G->thunkpos;
              iVar8 = yy_ws(G);
            } while (iVar8 != 0);
            G->pos = iVar7;
            G->thunkpos = iVar10;
            iVar7 = yy_list_prefix_expr(G);
            if (iVar7 == 0) goto LAB_00118a06;
            iVar5 = 0;
            yyDo(G,yySet,-1,0,"yySet");
            yyDo(G,yy_5_list_prefix_expr,G->begin,G->end,"yy_5_list_prefix_expr");
            iVar7 = extraout_EAX_01;
          }
        }
      }
      else {
        iVar10 = G->pos;
        iVar8 = G->thunkpos;
        iVar7 = yymatchChar(G,0x3d);
        iVar5 = 6;
        if (iVar7 == 0) {
          G->pos = iVar10;
          G->thunkpos = iVar8;
          iVar5 = 0;
        }
        if (iVar5 == 6) goto LAB_00118859;
        if (iVar5 == 0) {
          do {
            iVar7 = G->pos;
            iVar10 = G->thunkpos;
            iVar8 = yy_ws(G);
          } while (iVar8 != 0);
          G->pos = iVar7;
          G->thunkpos = iVar10;
          iVar7 = yy_list_prefix_expr(G);
          if (iVar7 == 0) goto LAB_00118859;
          yyDo(G,yySet,-1,0,"yySet");
          iVar7 = G->begin;
          iVar10 = G->end;
          pcVar11 = yy_3_list_prefix_expr;
          pcVar12 = "yy_3_list_prefix_expr";
LAB_00118928:
          yyDo(G,pcVar11,iVar7,iVar10,pcVar12);
          iVar5 = 8;
          iVar7 = extraout_EAX_00;
        }
      }
LAB_00118a0c:
      if (iVar5 == 0) {
LAB_00118a1d:
        iVar5 = 5;
      }
      else if (iVar5 == 0xb) {
        G->pos = iVar3;
        G->thunkpos = iVar4;
        iVar5 = 0;
      }
      else if (iVar5 == 8) goto LAB_00118a1d;
    } while (iVar5 != 0);
    iVar10 = 0;
  }
LAB_00118a3a:
  if (iVar10 != 0) {
    if (iVar10 == 4) {
      G->pos = iVar1;
      G->thunkpos = iVar2;
      return 0;
    }
    if (iVar10 != 3) {
      return iVar7;
    }
  }
  yyDo(G,yyPop,4,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_list_prefix_expr(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 4, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "list_prefix_expr"));

  {  int yypos754= G->pos, yythunkpos754= G->thunkpos;  if (!yymatchChar(G, '[')) goto l755;
  if (!yy_reduce_operator(G))  goto l755;
  yyDo(G, yySet, -4, 0, "yySet");
  if (!yymatchChar(G, ']')) goto l755;
  if (!yy__(G))  goto l755;
  if (!yy_list_infix_expr(G))  goto l755;
  yyDo(G, yySet, -3, 0, "yySet");
  yyDo(G, yy_1_list_prefix_expr, G->begin, G->end, "yy_1_list_prefix_expr");
  goto l754;
  l755:;	  G->pos= yypos754; G->thunkpos= yythunkpos754;  if (!yy_list_infix_expr(G))  goto l753;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_2_list_prefix_expr, G->begin, G->end, "yy_2_list_prefix_expr");

  l756:;	
  {  int yypos757= G->pos, yythunkpos757= G->thunkpos;
  {  int yypos758= G->pos, yythunkpos758= G->thunkpos;  if (!yy__(G))  goto l759;
  if (!yymatchChar(G, '=')) goto l759;

  {  int yypos760= G->pos, yythunkpos760= G->thunkpos;  if (!yymatchChar(G, '=')) goto l760;
  goto l759;
  l760:;	  G->pos= yypos760; G->thunkpos= yythunkpos760;
  }  if (!yy__(G))  goto l759;
  if (!yy_list_prefix_expr(G))  goto l759;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_3_list_prefix_expr, G->begin, G->end, "yy_3_list_prefix_expr");
  goto l758;
  l759:;	  G->pos= yypos758; G->thunkpos= yythunkpos758;  if (!yy__(G))  goto l761;
  if (!yymatchString(G, ":=")) goto l761;

  {  int yypos762= G->pos, yythunkpos762= G->thunkpos;  if (!yymatchChar(G, '=')) goto l762;
  goto l761;
  l762:;	  G->pos= yypos762; G->thunkpos= yythunkpos762;
  }  if (!yy__(G))  goto l761;
  if (!yy_list_prefix_expr(G))  goto l761;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_4_list_prefix_expr, G->begin, G->end, "yy_4_list_prefix_expr");
  goto l758;
  l761:;	  G->pos= yypos758; G->thunkpos= yythunkpos758;  if (!yy__(G))  goto l757;
  if (!yymatchString(G, "::=")) goto l757;

  {  int yypos763= G->pos, yythunkpos763= G->thunkpos;  if (!yymatchChar(G, '=')) goto l763;
  goto l757;
  l763:;	  G->pos= yypos763; G->thunkpos= yythunkpos763;
  }  if (!yy__(G))  goto l757;
  if (!yy_list_prefix_expr(G))  goto l757;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_5_list_prefix_expr, G->begin, G->end, "yy_5_list_prefix_expr");

  }
  l758:;	  goto l756;
  l757:;	  G->pos= yypos757; G->thunkpos= yythunkpos757;
  }
  }
  l754:;	  yyprintf((stderr, "  ok   list_prefix_expr"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 4, 0, "yyPop");
  return 1;
  l753:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "list_prefix_expr"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}